

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOR<std::complex<double>>::Assemble(TPZStructMatrixOR<std::complex<double>> *this)

{
  TPZAutoPointer<TPZGuiInterface> *in_stack_00000148;
  TPZBaseMatrix *in_stack_00000150;
  TPZBaseMatrix *in_stack_00000158;
  TPZStructMatrixOR<std::complex<double>_> *in_stack_00000160;
  
  TPZStructMatrixOR<std::complex<double>_>::Assemble
            (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
  return;
}

Assistant:

void 
TPZStructMatrixOR<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhsloc, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhsloc, guiInterface);
        }

        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    } else {
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhs, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhs, guiInterface);
        }
    }
    ass_stiff.stop();
}